

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIf(AsmJSByteCodeGenerator *this,ParseNodeIf *pnode)

{
  AsmJsType local_64;
  EmitExpressionInfo local_60;
  EmitExpressionInfo *local_58;
  EmitExpressionInfo *falseInfo;
  EmitExpressionInfo EStack_48;
  ByteCodeLabel skipLabel;
  EmitExpressionInfo *local_40;
  EmitExpressionInfo *trueInfo;
  EmitExpressionInfo *local_30;
  EmitExpressionInfo *boolInfo;
  ByteCodeLabel falseLabel;
  ByteCodeLabel trueLabel;
  ParseNodeIf *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  
  _falseLabel = pnode;
  pnode_local = (ParseNodeIf *)this;
  boolInfo._4_4_ = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  boolInfo._0_4_ = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  trueInfo = (EmitExpressionInfo *)
             EmitBooleanExpression
                       (this,_falseLabel->pnodeCond,boolInfo._4_4_,(ByteCodeLabel)boolInfo);
  local_30 = (EmitExpressionInfo *)&trueInfo;
  AsmJsFunc::ReleaseLocation<int>(this->mFunction,local_30);
  AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,boolInfo._4_4_);
  EStack_48 = Emit(this,_falseLabel->pnodeTrue);
  local_40 = &stack0xffffffffffffffb8;
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,local_40);
  if (_falseLabel->pnodeFalse == (ParseNodePtr)0x0) {
    AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,(ByteCodeLabel)boolInfo);
  }
  else {
    falseInfo._4_4_ = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
    ByteCodeWriter::RecordStatementAdjustment
              (&(this->mWriter).super_ByteCodeWriter,SAT_FromCurrentToNext);
    AsmJsByteCodeWriter::AsmBr(&this->mWriter,falseInfo._4_4_,AsmBr);
    AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,(ByteCodeLabel)boolInfo);
    local_60 = Emit(this,_falseLabel->pnodeFalse);
    local_58 = &local_60;
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,local_58);
    AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,falseInfo._4_4_);
  }
  if (((_falseLabel->super_ParseNodeStmt).emitLabels & 1U) != 0) {
    AsmJsByteCodeWriter::MarkAsmJsLabel
              (&this->mWriter,(_falseLabel->super_ParseNodeStmt).breakLabel);
  }
  AsmJsType::AsmJsType(&local_64,Void);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_64);
  return (EmitExpressionInfo)this_local;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitIf( ParseNodeIf * pnode )
    {
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->pnodeCond, trueLabel, falseLabel );
        mFunction->ReleaseLocation<int>( &boolInfo );


        mWriter.MarkAsmJsLabel( trueLabel );

        const EmitExpressionInfo& trueInfo = Emit( pnode->pnodeTrue );
        mFunction->ReleaseLocationGeneric( &trueInfo );

        if( pnode->pnodeFalse != nullptr )
        {
            // has else clause
            Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();

            // Record the branch bytecode offset
            mWriter.RecordStatementAdjustment( Js::FunctionBody::SAT_FromCurrentToNext );

            // then clause skips else clause
            mWriter.AsmBr( skipLabel );
            // generate code for else clause
            mWriter.MarkAsmJsLabel( falseLabel );

            const EmitExpressionInfo& falseInfo = Emit( pnode->pnodeFalse );
            mFunction->ReleaseLocationGeneric( &falseInfo );

            mWriter.MarkAsmJsLabel( skipLabel );

        }
        else
        {
            mWriter.MarkAsmJsLabel( falseLabel );
        }
        if( pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }
        return EmitExpressionInfo( AsmJsType::Void );
    }